

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::setCharFormat
          (QTextDocumentPrivate *this,int pos,int length,QTextCharFormat *newFormat,
          FormatChangeMode mode)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  int in_EDX;
  int in_ESI;
  QTextDocumentPrivate *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int n;
  int oldFormat;
  int length_1;
  int offset;
  QTextFragmentData *fragment;
  int endPos;
  int startPos;
  int newFormatIdx;
  QTextUndoCommand c;
  QTextBlock endIt;
  QTextBlock blockIt;
  QTextCharFormat f_1;
  QTextFormat format_1;
  Iterator it;
  QTextCharFormat f;
  QTextFormat format;
  QTextCharFormat cleanFormat;
  uint in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe8d;
  bool bVar7;
  byte in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  int in_stack_fffffffffffffe90;
  undefined2 in_stack_fffffffffffffe94;
  byte in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  uint in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  uint in_stack_fffffffffffffea8;
  uint uVar8;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  int iVar9;
  int in_stack_fffffffffffffeb4;
  QTextDocumentPrivate *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffecc;
  int iVar10;
  int local_120;
  int local_11c;
  int local_f0;
  int local_ec;
  QTextBlock local_e8;
  QTextBlock local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  beginEditBlock(in_RDI);
  iVar10 = -1;
  if (in_R8D == 2) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCharFormat::QTextCharFormat
              ((QTextCharFormat *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))),
               (QTextCharFormat *)
               CONCAT17(in_stack_fffffffffffffe8f,
                        CONCAT16(in_stack_fffffffffffffe8e,
                                 CONCAT15(in_stack_fffffffffffffe8d,
                                          CONCAT14(in_stack_fffffffffffffe8c,
                                                   in_stack_fffffffffffffe88)))));
    QTextFormat::clearProperty
              ((QTextFormat *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))),
               CONCAT13(in_stack_fffffffffffffe8f,
                        CONCAT12(in_stack_fffffffffffffe8e,
                                 CONCAT11(in_stack_fffffffffffffe8d,in_stack_fffffffffffffe8c))));
    iVar10 = QTextFormatCollection::indexForFormat
                       ((QTextFormatCollection *)in_stack_fffffffffffffeb8,
                        (QTextFormat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                       );
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7d3d5a);
  }
  else if (in_R8D == 1) {
    iVar10 = QTextFormatCollection::indexForFormat
                       ((QTextFormatCollection *)in_stack_fffffffffffffeb8,
                        (QTextFormat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                       );
  }
  local_120 = in_EDX;
  local_11c = in_ESI;
  if (in_ESI == -1) {
    if (in_R8D == 0) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormatCollection::format
                ((QTextFormatCollection *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea4);
      QTextFormat::merge((QTextFormat *)CONCAT44(in_R8D,iVar10),
                         (QTextFormat *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      iVar2 = QTextFormatCollection::indexForFormat
                        ((QTextFormatCollection *)in_stack_fffffffffffffeb8,
                         (QTextFormat *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      in_RDI->initialBlockCharFormatIndex = iVar2;
      QTextFormat::~QTextFormat((QTextFormat *)0x7d3e1a);
    }
    else {
      in_stack_fffffffffffffecc = in_stack_fffffffffffffecc & 0xffffff;
      in_stack_fffffffffffffe96 = false;
      if (in_R8D == 2) {
        QTextFormatCollection::format
                  ((QTextFormatCollection *)
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea4);
        in_stack_fffffffffffffecc = CONCAT13(1,(int3)in_stack_fffffffffffffecc);
        iVar2 = QTextFormat::objectIndex
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        in_stack_fffffffffffffe96 = iVar2 != -1;
      }
      in_stack_fffffffffffffe97 = in_stack_fffffffffffffe96;
      if ((in_stack_fffffffffffffecc & 0x1000000) != 0) {
        QTextFormat::~QTextFormat((QTextFormat *)0x7d3e8f);
      }
      if ((in_stack_fffffffffffffe96 & 1) == 0) {
        in_RDI->initialBlockCharFormatIndex = iVar10;
      }
      else {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCharFormat::QTextCharFormat
                  ((QTextCharFormat *)
                   CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)))
                   ,(QTextCharFormat *)
                    CONCAT17(in_stack_fffffffffffffe8f,
                             CONCAT16(in_stack_fffffffffffffe8e,
                                      CONCAT15(in_stack_fffffffffffffe8d,
                                               CONCAT14(in_stack_fffffffffffffe8c,
                                                        in_stack_fffffffffffffe88)))));
        QTextFormatCollection::format
                  ((QTextFormatCollection *)
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea4);
        QTextFormat::objectIndex
                  ((QTextFormat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        QTextFormat::setObjectIndex
                  ((QTextFormat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea4);
        QTextFormat::~QTextFormat((QTextFormat *)0x7d3f17);
        iVar2 = QTextFormatCollection::indexForFormat
                          ((QTextFormatCollection *)in_stack_fffffffffffffeb8,
                           (QTextFormat *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        in_RDI->initialBlockCharFormatIndex = iVar2;
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7d3f4a);
      }
    }
    local_11c = 0;
    local_120 = in_EDX + -1;
  }
  local_120 = local_11c + local_120;
  iVar2 = local_11c;
  split(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  split(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  for (; local_11c < local_120; local_11c = iVar9 + local_11c) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QFragmentMap<QTextFragmentData>::find
              ((QFragmentMap<QTextFragmentData> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
    in_stack_fffffffffffffeb8 =
         (QTextDocumentPrivate *)
         QFragmentMap<QTextFragmentData>::Iterator::value((Iterator *)0x7d3ffb);
    in_stack_fffffffffffffe90 = local_11c;
    iVar3 = QFragmentMap<QTextFragmentData>::Iterator::position((Iterator *)0x7d4015);
    iVar3 = in_stack_fffffffffffffe90 - iVar3;
    local_ec = local_120 - local_11c;
    local_f0 = *(quint32 *)&in_stack_fffffffffffffeb8->field_0x14 - iVar3;
    piVar6 = qMin<int>(&local_ec,&local_f0);
    iVar9 = *piVar6;
    in_stack_fffffffffffffeac = *(int *)&in_stack_fffffffffffffeb8->field_0x1c;
    if (in_R8D == 0) {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormatCollection::format
                ((QTextFormatCollection *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea4);
      QTextFormat::merge((QTextFormat *)CONCAT44(in_R8D,iVar10),
                         (QTextFormat *)CONCAT44(in_stack_fffffffffffffecc,iVar2));
      iVar3 = QTextFormatCollection::indexForFormat
                        ((QTextFormatCollection *)in_stack_fffffffffffffeb8,
                         (QTextFormat *)CONCAT44(iVar3,iVar9));
      *(int *)&in_stack_fffffffffffffeb8->field_0x1c = iVar3;
      QTextFormat::~QTextFormat((QTextFormat *)0x7d40f6);
    }
    else {
      uVar8 = in_stack_fffffffffffffea8 & 0xffffff;
      in_stack_fffffffffffffe8e = false;
      if (in_R8D == 2) {
        QTextFormatCollection::format
                  ((QTextFormatCollection *)
                   (CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8) &
                   0xffffffff00ffffff),in_stack_fffffffffffffea4);
        uVar8 = CONCAT13(1,(int3)uVar8);
        iVar4 = QTextFormat::objectIndex
                          ((QTextFormat *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        in_stack_fffffffffffffe8e = iVar4 != -1;
      }
      in_stack_fffffffffffffea8 = uVar8;
      in_stack_fffffffffffffe8f = in_stack_fffffffffffffe8e;
      if ((in_stack_fffffffffffffea8 & 0x1000000) != 0) {
        QTextFormat::~QTextFormat((QTextFormat *)0x7d4166);
      }
      if ((in_stack_fffffffffffffe8e & 1) == 0) {
        *(int *)&in_stack_fffffffffffffeb8->field_0x1c = iVar10;
      }
      else {
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        QTextCharFormat::QTextCharFormat
                  ((QTextCharFormat *)
                   CONCAT17(in_stack_fffffffffffffe97,
                            CONCAT16(in_stack_fffffffffffffe96,
                                     CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)))
                   ,(QTextCharFormat *)
                    CONCAT17(in_stack_fffffffffffffe8f,
                             CONCAT16(in_stack_fffffffffffffe8e,
                                      CONCAT15(in_stack_fffffffffffffe8d,
                                               CONCAT14(in_stack_fffffffffffffe8c,
                                                        in_stack_fffffffffffffe88)))));
        QTextFormatCollection::format
                  ((QTextFormatCollection *)
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea4);
        QTextFormat::objectIndex
                  ((QTextFormat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        QTextFormat::setObjectIndex
                  ((QTextFormat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea4);
        QTextFormat::~QTextFormat((QTextFormat *)0x7d41e9);
        iVar3 = QTextFormatCollection::indexForFormat
                          ((QTextFormatCollection *)in_stack_fffffffffffffeb8,
                           (QTextFormat *)CONCAT44(iVar3,iVar9));
        *(int *)&in_stack_fffffffffffffeb8->field_0x1c = iVar3;
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7d4219);
      }
    }
    appendUndoItem((QTextDocumentPrivate *)
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (QTextUndoCommand *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                  );
  }
  uVar5 = QFragmentMap<QTextFragmentData>::findNode
                    ((QFragmentMap<QTextFragmentData> *)
                     CONCAT17(in_stack_fffffffffffffe97,
                              CONCAT16(in_stack_fffffffffffffe96,
                                       CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                                      )),
                     CONCAT13(in_stack_fffffffffffffe8f,
                              CONCAT12(in_stack_fffffffffffffe8e,
                                       CONCAT11(in_stack_fffffffffffffe8d,in_stack_fffffffffffffe8c)
                                      )),in_stack_fffffffffffffe88);
  if (uVar5 != 0) {
    unite((QTextDocumentPrivate *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
          uVar5);
  }
  uVar5 = QFragmentMap<QTextFragmentData>::findNode
                    ((QFragmentMap<QTextFragmentData> *)
                     CONCAT17(in_stack_fffffffffffffe97,
                              CONCAT16(in_stack_fffffffffffffe96,
                                       CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                                      )),
                     CONCAT13(in_stack_fffffffffffffe8f,
                              CONCAT12(in_stack_fffffffffffffe8e,
                                       CONCAT11(in_stack_fffffffffffffe8d,in_stack_fffffffffffffe8c)
                                      )),in_stack_fffffffffffffe88);
  if (uVar5 != 0) {
    unite((QTextDocumentPrivate *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
          uVar5);
  }
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  blocksFind((QTextDocumentPrivate *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             uVar5);
  local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  blocksFind((QTextDocumentPrivate *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             uVar5);
  bVar1 = QTextBlock::isValid((QTextBlock *)
                              CONCAT17(in_stack_fffffffffffffe97,
                                       CONCAT16(in_stack_fffffffffffffe96,
                                                CONCAT24(in_stack_fffffffffffffe94,
                                                         in_stack_fffffffffffffe90))));
  if (bVar1) {
    QTextBlock::next((QTextBlock *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    QTextBlock::operator=((QTextBlock *)local_c8,&local_d8);
  }
  while( true ) {
    bVar1 = QTextBlock::isValid((QTextBlock *)
                                CONCAT17(in_stack_fffffffffffffe97,
                                         CONCAT16(in_stack_fffffffffffffe96,
                                                  CONCAT24(in_stack_fffffffffffffe94,
                                                           in_stack_fffffffffffffe90))));
    bVar7 = false;
    if (bVar1) {
      bVar7 = QTextBlock::operator!=((QTextBlock *)local_b8,(QTextBlock *)local_c8);
    }
    if (bVar7 == false) break;
    block((QTextBlock *)0x7d442d);
    QTextBlockData::invalidate
              ((QTextBlockData *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))));
    QTextBlock::next((QTextBlock *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    QTextBlock::operator=((QTextBlock *)local_b8,&local_e8);
  }
  documentChange((QTextDocumentPrivate *)CONCAT44(uVar5,in_stack_fffffffffffffea0),
                 (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)((ulong)in_RDI >> 0x20));
  endEditBlock((QTextDocumentPrivate *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT24(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::setCharFormat(int pos, int length, const QTextCharFormat &newFormat, FormatChangeMode mode)
{
    beginEditBlock();

    Q_ASSERT(newFormat.isValid());

    int newFormatIdx = -1;
    if (mode == SetFormatAndPreserveObjectIndices) {
        QTextCharFormat cleanFormat = newFormat;
        cleanFormat.clearProperty(QTextFormat::ObjectIndex);
        newFormatIdx = formats.indexForFormat(cleanFormat);
    } else if (mode == SetFormat) {
        newFormatIdx = formats.indexForFormat(newFormat);
    }

    if (pos == -1) {
        if (mode == MergeFormat) {
            QTextFormat format = formats.format(initialBlockCharFormatIndex);
            format.merge(newFormat);
            initialBlockCharFormatIndex = formats.indexForFormat(format);
        } else if (mode == SetFormatAndPreserveObjectIndices
                   && formats.format(initialBlockCharFormatIndex).objectIndex() != -1) {
            QTextCharFormat f = newFormat;
            f.setObjectIndex(formats.format(initialBlockCharFormatIndex).objectIndex());
            initialBlockCharFormatIndex = formats.indexForFormat(f);
        } else {
            initialBlockCharFormatIndex = newFormatIdx;
        }

        ++pos;
        --length;
    }

    const int startPos = pos;
    const int endPos = pos + length;

    split(startPos);
    split(endPos);

    while (pos < endPos) {
        FragmentMap::Iterator it = fragments.find(pos);
        Q_ASSERT(!it.atEnd());

        QTextFragmentData *fragment = it.value();

        Q_ASSERT(formats.format(fragment->format).type() == QTextFormat::CharFormat);

        int offset = pos - it.position();
        int length = qMin(endPos - pos, int(fragment->size_array[0] - offset));
        int oldFormat = fragment->format;

        if (mode == MergeFormat) {
            QTextFormat format = formats.format(fragment->format);
            format.merge(newFormat);
            fragment->format = formats.indexForFormat(format);
        } else if (mode == SetFormatAndPreserveObjectIndices
                   && formats.format(oldFormat).objectIndex() != -1) {
            QTextCharFormat f = newFormat;
            f.setObjectIndex(formats.format(oldFormat).objectIndex());
            fragment->format = formats.indexForFormat(f);
        } else {
            fragment->format = newFormatIdx;
        }

        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::CharFormatChanged, true, QTextUndoCommand::MoveCursor, oldFormat,
                                0, pos, length, 0);
        appendUndoItem(c);

        pos += length;
        Q_ASSERT(q20::cmp_equal(pos, (it.position() + fragment->size_array[0])) || pos >= endPos);
    }

    int n = fragments.findNode(startPos - 1);
    if (n)
        unite(n);

    n = fragments.findNode(endPos);
    if (n)
        unite(n);

    QTextBlock blockIt = blocksFind(startPos);
    QTextBlock endIt = blocksFind(endPos);
    if (endIt.isValid())
        endIt = endIt.next();
    for (; blockIt.isValid() && blockIt != endIt; blockIt = blockIt.next())
        QTextDocumentPrivate::block(blockIt)->invalidate();

    documentChange(startPos, length);

    endEditBlock();
}